

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

void __thiscall QCss::ValueExtractor::lengthValues(ValueExtractor *this,Declaration *decl,int *m)

{
  bool bVar1;
  int iVar2;
  P _a;
  QMetaType QVar3;
  pointer pVVar4;
  ulong uVar5;
  long lVar6;
  DeclarationData *pDVar7;
  ValueExtractor *this_00;
  QArrayDataPointer<QVariant> *pQVar8;
  QVariant **ppQVar9;
  long *plVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LengthData LVar16;
  LengthData t;
  QArrayDataPointer<QVariant> local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QArrayDataPointer<QVariant> local_78;
  undefined8 uStack_60;
  Data *local_58;
  QVariant *pQStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (3 < *(ulong *)&(((decl->d).d.ptr)->parsed).d.field_0x18) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    lVar6 = 0;
    do {
      local_b8.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QCss::LengthData>::metaType;
      plVar10 = (long *)((long)&((local_78.ptr)->d).data + lVar6);
      local_98.shared =
           (PrivateShared *)
           (*(ulong *)(&((local_78.ptr)->d).field_0x18 + lVar6) & 0xfffffffffffffffc);
      bVar1 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_b8);
      if (bVar1) {
        if ((*(byte *)(plVar10 + 3) & 1) != 0) {
          plVar10 = (long *)((long)*(int *)(*plVar10 + 4) + *plVar10);
        }
        local_98.shared = (PrivateShared *)*plVar10;
        local_98._8_8_ = plVar10[1];
      }
      else {
        local_98.shared = (PrivateShared *)0x0;
        local_98._8_8_ = 0;
        QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((*(byte *)(plVar10 + 3) & 1) != 0) {
          plVar10 = (long *)((long)*(int *)(*plVar10 + 4) + *plVar10);
        }
        QMetaType::convert(QVar3,plVar10,(QMetaType)local_b8.d,&local_98);
      }
      iVar2 = lengthValueFromData((LengthData *)&local_98,&this->f);
      *m = iVar2;
      m = m + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x80);
    pQVar8 = &local_78;
    goto LAB_005e5a02;
  }
  local_78.d = (Data *)0xffffffffffffffff;
  local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.size = -1;
  uStack_60 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Data *)0xffffffffffffffff;
  pQStack_50 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xffffffffffffffff;
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  pDVar7 = (decl->d).d.ptr;
  if ((pDVar7->values).d.size == 0) {
    uVar11 = 0;
  }
  else {
    ppQVar9 = &local_78.ptr;
    lVar6 = 0;
    uVar11 = 0;
    do {
      this_00 = (ValueExtractor *)&pDVar7->values;
      pVVar4 = QList<QCss::Value>::data((QList<QCss::Value> *)this_00);
      LVar16 = lengthValue(this_00,(Value *)((long)&pVVar4->type + lVar6));
      ((QArrayDataPointer<QVariant> *)(ppQVar9 + -1))->d = (Data *)LVar16.number;
      *(anon_enum_32 *)ppQVar9 = LVar16.unit;
      uVar11 = uVar11 + 1;
      pDVar7 = (decl->d).d.ptr;
      uVar5 = (pDVar7->values).d.size;
      if (3 < (long)uVar5) {
        uVar5 = 4;
      }
      lVar6 = lVar6 + 0x28;
      ppQVar9 = ppQVar9 + 2;
    } while (uVar11 < uVar5);
  }
  switch(uVar11 & 0xffffffff) {
  case 0:
    local_48 = 0;
    uStack_40 = (undefined1 *)0x0;
    local_58 = (Data *)0x0;
    pQStack_50 = (QVariant *)0x0;
    local_78.size = 0;
    uStack_60 = (QVariant *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QVariant *)0x0;
    break;
  case 1:
    local_78.size = (qsizetype)local_78.d;
    uStack_60 = local_78.ptr;
    local_58 = local_78.d;
    pQStack_50 = local_78.ptr;
    uVar12 = local_78.d._0_4_;
    uVar13 = local_78.d._4_4_;
    uVar14 = local_78.ptr._0_4_;
    uVar15 = local_78.ptr._4_4_;
    goto LAB_005e5945;
  case 2:
    local_58 = local_78.d;
    pQStack_50 = local_78.ptr;
  case 3:
    uVar12 = (undefined4)local_78.size;
    uVar13 = local_78.size._4_4_;
    uVar14 = (undefined4)uStack_60;
    uVar15 = uStack_60._4_4_;
LAB_005e5945:
    local_48 = CONCAT44(uVar13,uVar12);
    uStack_40 = (undefined1 *)CONCAT44(uVar15,uVar14);
  }
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QVariant *)0x0;
  local_b8.size = 0;
  QList<QVariant>::reserve((QList<QVariant> *)&local_b8,4);
  pQVar8 = &local_78;
  lVar6 = 0;
  do {
    ::QVariant::QVariant((QVariant *)&local_98,(QMetaType)0x809308,pQVar8);
    QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
              ((QMovableArrayOps<QVariant> *)&local_b8,local_b8.size,(QVariant *)&local_98);
    QList<QVariant>::end((QList<QVariant> *)&local_b8);
    ::QVariant::~QVariant((QVariant *)&local_98);
    iVar2 = lengthValueFromData((LengthData *)pQVar8,&this->f);
    m[lVar6] = iVar2;
    lVar6 = lVar6 + 1;
    pQVar8 = (QArrayDataPointer<QVariant> *)&pQVar8->size;
  } while (lVar6 != 4);
  pQVar8 = &local_b8;
  ::QVariant::QVariant((QVariant *)&local_98,(QList_conflict *)pQVar8);
  ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_98);
LAB_005e5a02:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValueExtractor::lengthValues(const Declaration &decl, int *m)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        Q_ASSERT(v.size() == 4);
        for (int i = 0; i < 4; i++)
            m[i] = lengthValueFromData(qvariant_cast<LengthData>(v.at(i)), f);
        return;
    }

    LengthData datas[4];
    int i;
    for (i = 0; i < qMin(decl.d->values.size(), 4); i++)
        datas[i] = lengthValue(decl.d->values[i]);

    if (i == 0) {
        LengthData zero = {0.0, LengthData::None};
        datas[0] = datas[1] = datas[2] = datas[3] = zero;
    } else if (i == 1) {
        datas[3] = datas[2] = datas[1] = datas[0];
    } else if (i == 2) {
        datas[2] = datas[0];
        datas[3] = datas[1];
    } else if (i == 3) {
        datas[3] = datas[1];
    }

    QList<QVariant> v;
    v.reserve(4);
    for (i = 0; i < 4; i++) {
        v += QVariant::fromValue<LengthData>(datas[i]);
        m[i] = lengthValueFromData(datas[i], f);
    }
    decl.d->parsed = v;
}